

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::UnicodeOperator>
               (string_t *ldata,int *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int *piVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  char **ppcVar7;
  ulong uVar8;
  ulong uVar9;
  utf8proc_uint8_t *puVar10;
  ulong uVar11;
  idx_t iVar12;
  unsigned_long uVar13;
  ulong uVar14;
  char **local_78;
  idx_t local_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_58;
  int *local_50;
  ValidityMask *local_48;
  ulong local_40;
  ulong local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_50 = result_data;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &(ldata->value).pointer.ptr;
      iVar12 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_78 + -1);
        local_68._0_4_ = paVar1->length;
        local_68._4_1_ = paVar1->prefix[0];
        local_68._5_1_ = paVar1->prefix[1];
        local_68._6_1_ = paVar1->prefix[2];
        local_68._7_1_ = paVar1->prefix[3];
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_78;
        puVar10 = (utf8proc_uint8_t *)p_Stack_60;
        if (((ulong)local_68 & 0xffffffff) < 0xd) {
          puVar10 = (utf8proc_uint8_t *)((long)&local_68 + 4);
        }
        utf8proc_iterate(puVar10,(ulong)local_68 & 0xffffffff,(utf8proc_int32_t *)&local_70);
        local_50[iVar12] = (int)local_70;
        iVar12 = iVar12 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar12);
    }
  }
  else {
    local_58 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_70 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_70);
      p_Var4 = p_Stack_60;
      peVar3 = local_68;
      local_68 = (element_type *)0x0;
      p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < local_58 + 0x3f) {
      local_40 = local_58 + 0x3f >> 6;
      local_38 = 0;
      uVar11 = local_58;
      uVar14 = 0;
      local_48 = mask;
      do {
        piVar5 = local_50;
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = puVar2[local_38];
        }
        uVar9 = uVar14 + 0x40;
        if (uVar11 <= uVar14 + 0x40) {
          uVar9 = uVar11;
        }
        uVar8 = uVar9;
        if (uVar13 != 0) {
          uVar8 = uVar14;
          if (uVar13 == 0xffffffffffffffff) {
            if (uVar14 < uVar9) {
              ppcVar7 = &ldata[uVar14].value.pointer.ptr;
              do {
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar7 + -1);
                local_68._0_4_ = paVar1->length;
                local_68._4_1_ = paVar1->prefix[0];
                local_68._5_1_ = paVar1->prefix[1];
                local_68._6_1_ = paVar1->prefix[2];
                local_68._7_1_ = paVar1->prefix[3];
                p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar7;
                puVar10 = (utf8proc_uint8_t *)p_Stack_60;
                if (((ulong)local_68 & 0xffffffff) < 0xd) {
                  puVar10 = (utf8proc_uint8_t *)((long)&local_68 + 4);
                }
                utf8proc_iterate(puVar10,(ulong)local_68 & 0xffffffff,(utf8proc_int32_t *)&local_70)
                ;
                piVar5[uVar14] = (int)local_70;
                uVar14 = uVar14 + 1;
                ppcVar7 = ppcVar7 + 2;
                uVar8 = uVar14;
              } while (uVar9 != uVar14);
            }
          }
          else {
            mask = local_48;
            if (uVar14 < uVar9) {
              ppcVar7 = &ldata[uVar14].value.pointer.ptr;
              uVar8 = 0;
              do {
                if ((uVar13 >> (uVar8 & 0x3f) & 1) != 0) {
                  paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar7 + -1);
                  local_68._0_4_ = paVar1->length;
                  local_68._4_1_ = paVar1->prefix[0];
                  local_68._5_1_ = paVar1->prefix[1];
                  local_68._6_1_ = paVar1->prefix[2];
                  local_68._7_1_ = paVar1->prefix[3];
                  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar7;
                  puVar10 = (utf8proc_uint8_t *)p_Stack_60;
                  if (((ulong)local_68 & 0xffffffff) < 0xd) {
                    puVar10 = (utf8proc_uint8_t *)((long)&local_68 + 4);
                  }
                  utf8proc_iterate(puVar10,(ulong)local_68 & 0xffffffff,
                                   (utf8proc_int32_t *)&local_70);
                  piVar5[uVar14 + uVar8] = (int)local_70;
                }
                uVar8 = uVar8 + 1;
                ppcVar7 = ppcVar7 + 2;
              } while ((uVar14 - uVar9) + uVar8 != 0);
              mask = local_48;
              uVar11 = local_58;
              uVar8 = uVar14 + uVar8;
            }
          }
        }
        local_38 = local_38 + 1;
        uVar14 = uVar8;
      } while (local_38 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}